

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void ravi_closure_setenv(lua_State *L)

{
  ushort uVar1;
  lua_CFunction p_Var2;
  Table *t;
  long *plVar3;
  GCObject *pGVar4;
  TValue *pTVar5;
  char *pcVar6;
  
  if (L->top[-1].tt_ == 0x8006) {
    p_Var2 = L->top[-1].value_.f;
    if (p_Var2[8] == (_func_int_lua_State_ptr)0x6) {
      if (p_Var2[10] == (_func_int_lua_State_ptr)0x0) {
        return;
      }
      if ((L->l_G->l_registry).tt_ == 0x8005) {
        t = (Table *)(L->l_G->l_registry).value_.gc;
        if (t->tt == '\x05') {
          pTVar5 = luaH_getint(t,2);
          plVar3 = (long *)**(long **)(p_Var2 + 0x20);
          pGVar4 = (pTVar5->value_).gc;
          *plVar3 = (long)pGVar4;
          uVar1 = pTVar5->tt_;
          *(ushort *)(plVar3 + 1) = uVar1;
          if (-1 < (short)uVar1) {
            return;
          }
          if (((uVar1 & 0x7f) == (ushort)pGVar4->tt) &&
             ((pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
            if ((long *)**(long **)(p_Var2 + 0x20) != *(long **)(p_Var2 + 0x20) + 2) {
              return;
            }
            luaC_upvalbarrier_(L,(pTVar5->value_).gc);
            return;
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x53c,"void ravi_closure_setenv(lua_State *)");
        }
        pcVar6 = "(((&(L->l_G)->l_registry)->value_).gc)->tt == 5";
      }
      else {
        pcVar6 = "((((&(L->l_G)->l_registry))->tt_) == (((5) | (1 << 15))))";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x539,"void ravi_closure_setenv(lua_State *)");
    }
    pcVar6 = "(((L->top - 1)->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    pcVar6 = "((((L->top - 1))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x536,"void ravi_closure_setenv(lua_State *)");
}

Assistant:

LUA_API void ravi_closure_setenv(lua_State* L) {
  LClosure *f = clLvalue(L->top - 1);  /* get newly created function */
  if (f->nupvalues >= 1) {  /* does it have an upvalue? */
    /* get global table from registry */
    Table *reg = hvalue(&G(L)->l_registry);
    const TValue *gt = luaH_getint(reg, LUA_RIDX_GLOBALS);
    /* set global table as 1st upvalue of 'f' (may be LUA_ENV) */
    setobj(L, f->upvals[0]->v, gt);
    luaC_upvalbarrier(L, f->upvals[0], gt);
  }
}